

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

mqtt_queued_message * mqtt_mq_register(mqtt_message_queue *mq,size_t nbytes)

{
  size_t local_20;
  size_t nbytes_local;
  mqtt_message_queue *mq_local;
  
  mq->queue_tail = mq->queue_tail + -1;
  mq->queue_tail->start = mq->curr;
  mq->queue_tail->size = nbytes;
  mq->queue_tail->state = MQTT_QUEUED_UNSENT;
  mq->curr = mq->curr + nbytes;
  if ((mqtt_queued_message *)mq->curr < mq->queue_tail + -1) {
    local_20 = (long)mq->queue_tail + (-0x28 - (long)mq->curr);
  }
  else {
    local_20 = 0;
  }
  mq->curr_sz = local_20;
  return mq->queue_tail;
}

Assistant:

struct mqtt_queued_message* mqtt_mq_register(struct mqtt_message_queue *mq, size_t nbytes)
{
    /* make queued message header */
    --(mq->queue_tail);
    mq->queue_tail->start = mq->curr;
    mq->queue_tail->size = nbytes;
    mq->queue_tail->state = MQTT_QUEUED_UNSENT;

    /* move curr and recalculate curr_sz */
    mq->curr += nbytes;
    mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));

    return mq->queue_tail;
}